

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O1

void learn_batch(lda *l)

{
  sparse_parameters *this;
  lda_math_mode lVar1;
  vw *pvVar2;
  example *peVar3;
  float *pfVar4;
  shared_data *psVar5;
  pointer piVar6;
  uint32_t uVar7;
  weight *pwVar8;
  example **ppeVar9;
  ulong uVar10;
  pointer piVar11;
  weight *pwVar12;
  ostream *poVar13;
  uint32_t *puVar14;
  ulong uVar15;
  float *pfVar16;
  byte bVar17;
  pointer piVar18;
  v_array<example_*> *this_00;
  vw *all;
  vector<index_feature,_std::allocator<index_feature>_> *this_01;
  ulong uVar19;
  uint uVar20;
  long lVar21;
  ulong uVar22;
  uint64_t uVar23;
  pointer piVar24;
  bool bVar25;
  float fVar26;
  float fVar27;
  ulong extraout_XMM0_Qa;
  float local_5c;
  float local_58;
  float local_54;
  vector<index_feature,_std::allocator<index_feature>_> *local_50;
  v_array<example_*> *local_48;
  v_array<example_*> *local_40;
  float local_34;
  
  if ((l->sorted_features).super__Vector_base<index_feature,_std::allocator<index_feature>_>._M_impl
      .super__Vector_impl_data._M_start ==
      (l->sorted_features).super__Vector_base<index_feature,_std::allocator<index_feature>_>._M_impl
      .super__Vector_impl_data._M_finish) {
    ppeVar9 = (l->examples)._begin;
    if ((l->examples)._end != ppeVar9) {
      uVar19 = 0;
      do {
        v_array<float>::clear(&(ppeVar9[uVar19]->pred).scalars);
        v_array<float>::resize(&((l->examples)._begin[uVar19]->pred).scalars,l->topics);
        memset(((l->examples)._begin[uVar19]->pred).scalars._begin,0,l->topics << 2);
        peVar3 = (l->examples)._begin[uVar19];
        (peVar3->pred).scalars._end = (peVar3->pred).scalars._begin + l->topics;
        v_array<float>::clear(&((l->examples)._begin[uVar19]->pred).scalars);
        return_example(l->all,(l->examples)._begin[uVar19]);
        uVar19 = uVar19 + 1;
        ppeVar9 = (l->examples)._begin;
      } while (uVar19 < (ulong)((long)(l->examples)._end - (long)ppeVar9 >> 3));
    }
    v_array<example_*>::clear(&l->examples);
    return;
  }
  pvVar2 = l->all;
  if ((l->total_lambda)._end == (l->total_lambda)._begin) {
    if (l->all->lda != 0) {
      uVar19 = 0;
      do {
        local_5c = 0.0;
        v_array<float>::push_back(&l->total_lambda,&local_5c);
        uVar19 = uVar19 + 1;
      } while (uVar19 < l->all->lda);
    }
    bVar17 = (pvVar2->weights).sparse;
    puVar14 = &(pvVar2->weights).dense_weights._stride_shift;
    if ((bool)bVar17 != false) {
      puVar14 = &(pvVar2->weights).sparse_weights._stride_shift;
    }
    uVar7 = *puVar14;
    uVar19 = (pvVar2->weights).dense_weights._weight_mask;
    uVar22 = 0;
    do {
      if ((bVar17 & 1) == 0) {
        pwVar8 = (pvVar2->weights).dense_weights._begin + (uVar19 & uVar22);
      }
      else {
        pwVar8 = sparse_parameters::operator[](&(pvVar2->weights).sparse_weights,uVar22);
      }
      if (l->all->lda != 0) {
        uVar19 = 0;
        do {
          pfVar16 = (l->total_lambda)._begin;
          pfVar16[uVar19] = pwVar8[uVar19] + pfVar16[uVar19];
          uVar19 = uVar19 + 1;
        } while (uVar19 < l->all->lda);
      }
      bVar17 = (pvVar2->weights).sparse;
      uVar19 = (pvVar2->weights).dense_weights._weight_mask;
      uVar15 = uVar19;
      if ((bool)bVar17 != false) {
        uVar15 = (pvVar2->weights).sparse_weights._weight_mask;
      }
      uVar22 = uVar22 + (uint)(1 << ((byte)uVar7 & 0x1f));
    } while (uVar22 <= uVar15);
  }
  l->example_t = l->example_t + 1.0;
  v_array<float>::clear(&l->total_new);
  if (l->all->lda != 0) {
    uVar19 = 0;
    do {
      local_5c = 0.0;
      v_array<float>::push_back(&l->total_new,&local_5c);
      uVar19 = uVar19 + 1;
    } while (uVar19 < l->all->lda);
  }
  local_40 = (v_array<example_*> *)(l->examples)._begin;
  local_48 = (v_array<example_*> *)(l->examples)._end;
  uVar19 = (long)local_48 - (long)local_40 >> 3;
  piVar18 = (l->sorted_features).super__Vector_base<index_feature,_std::allocator<index_feature>_>.
            _M_impl.super__Vector_impl_data._M_start;
  piVar11 = (l->sorted_features).super__Vector_base<index_feature,_std::allocator<index_feature>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (piVar18 != piVar11) {
    uVar22 = ((long)piVar11 - (long)piVar18 >> 3) * -0x5555555555555555;
    lVar21 = 0x3f;
    if (uVar22 != 0) {
      for (; uVar22 >> lVar21 == 0; lVar21 = lVar21 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<index_feature*,std::vector<index_feature,std::allocator<index_feature>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (piVar18,piVar11,((uint)lVar21 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<index_feature*,std::vector<index_feature,std::allocator<index_feature>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (piVar18,piVar11);
  }
  fVar26 = l->all->eta;
  local_58 = lda::powf(l,(float)l->example_t,-l->all->power_t);
  local_58 = local_58 * fVar26;
  local_54 = 1.0 - local_58;
  local_50 = (vector<index_feature,_std::allocator<index_feature>_> *)
             CONCAT44(local_50._4_4_,(float)uVar19);
  local_34 = l->lda_D;
  fVar26 = (l->decay_levels)._end[-1];
  local_5c = logf(local_54);
  local_5c = local_5c + fVar26;
  v_array<float>::push_back(&l->decay_levels,&local_5c);
  v_array<float>::clear(&l->digammas);
  uVar7 = l->all->num_bits;
  if (l->all->lda != 0) {
    fVar26 = l->lda_rho;
    uVar22 = 0;
    do {
      local_5c = lda::digamma(l,(l->total_lambda)._begin[uVar22] +
                                (float)(ulong)(1L << ((byte)uVar7 & 0x3f)) * fVar26);
      v_array<float>::push_back(&l->digammas,&local_5c);
      uVar22 = uVar22 + 1;
    } while (uVar22 < l->all->lda);
  }
  piVar18 = (l->sorted_features).super__Vector_base<index_feature,_std::allocator<index_feature>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (piVar18 <=
      (l->sorted_features).super__Vector_base<index_feature,_std::allocator<index_feature>_>._M_impl
      .super__Vector_impl_data._M_finish + -1) {
    uVar22 = 0xffffffffffffffff;
    do {
      uVar15 = (piVar18->f).weight_index;
      if (uVar22 != uVar15) {
        bVar25 = (pvVar2->weights).sparse;
        uVar22 = (pvVar2->weights).dense_weights._weight_mask;
        uVar23 = uVar22;
        if (bVar25 != false) {
          uVar23 = (pvVar2->weights).sparse_weights._weight_mask;
        }
        if (bVar25 == true) {
          pwVar8 = sparse_parameters::operator[](&(pvVar2->weights).sparse_weights,uVar23 & uVar15);
        }
        else {
          pwVar8 = (pvVar2->weights).dense_weights._begin + (uVar23 & uVar15 & uVar22);
        }
        pfVar16 = (l->decay_levels)._end;
        fVar26 = expf(pfVar16[-2] -
                      pfVar16[(int)((double)pwVar8[l->all->lda] + (-1.0 - l->example_t))]);
        if (1.0 <= fVar26) {
          fVar26 = 1.0;
        }
        pfVar16 = pwVar8 + l->all->lda + 1;
        pwVar8[l->all->lda] = (float)l->example_t;
        all = l->all;
        uVar10 = (ulong)all->lda;
        if (uVar10 != 0) {
          uVar22 = 0;
          do {
            fVar27 = pwVar8[uVar22];
            pwVar8[uVar22] = fVar27 * fVar26;
            pfVar16[uVar22] = fVar27 * fVar26 + l->lda_rho;
            uVar22 = uVar22 + 1;
            all = l->all;
            uVar10 = (ulong)all->lda;
          } while (uVar22 < uVar10);
        }
        pfVar4 = (l->digammas)._begin;
        lVar1 = l->mmode;
        uVar22 = uVar15;
        if (lVar1 == USE_SIMD) {
          ldamath::vexpdigammify_2(all,pfVar16,pfVar4,1e-10);
        }
        else if (lVar1 == USE_PRECISE) {
          std::
          transform<float*,float*,float*,ldamath::expdigammify_2<float,(lda_math_mode)1>(vw&,float*,float*,float)::_lambda(float,float)_1_>
                    (pfVar16,pfVar16 + uVar10,pfVar4,pfVar16,(anon_class_4_1_b97a6b0b)0x2edbe6ff);
        }
        else {
          if (lVar1 != USE_FAST_APPROX) {
            poVar13 = std::operator<<((ostream *)&std::cerr,
                                      "lda::expdigammify_2: Trampled or invalid math mode, aborting"
                                     );
            std::endl<char,std::char_traits<char>>(poVar13);
            abort();
          }
          std::
          transform<float*,float*,float*,ldamath::expdigammify_2<float,(lda_math_mode)2>(vw&,float*,float*,float)::_lambda(float,float)_1_>
                    (pfVar16,pfVar16 + uVar10,pfVar4,pfVar16,(anon_class_4_1_b97a6b0b)0x2edbe6ff);
        }
      }
      piVar18 = piVar18 + 1;
    } while (piVar18 <=
             (l->sorted_features).super__Vector_base<index_feature,_std::allocator<index_feature>_>.
             _M_impl.super__Vector_impl_data._M_finish + -1);
  }
  this_00 = &l->examples;
  local_58 = local_58 * (local_34 / local_50._0_4_);
  uVar22 = (ulong)(uint)local_58;
  if (local_48 != local_40) {
    lVar21 = 0;
    do {
      fVar26 = lda_loop(l,&l->Elogtheta,(l->v)._begin + (ulong)l->all->lda * lVar21,
                        (l->examples)._begin[lVar21],(float)uVar22);
      if (l->all->audit == true) {
        GD::print_audit_features(l->all,this_00->_begin[lVar21]);
      }
      if (0 < (l->doc_lengths)._begin[lVar21]) {
        psVar5 = l->all->sd;
        psVar5->sum_loss = psVar5->sum_loss - (double)fVar26;
        psVar5 = l->all->sd;
        psVar5->sum_loss_since_last_dump = psVar5->sum_loss_since_last_dump - (double)fVar26;
      }
      return_example(l->all,(l->examples)._begin[lVar21]);
      lVar21 = lVar21 + 1;
      uVar22 = extraout_XMM0_Qa;
    } while (uVar19 + (uVar19 == 0) != lVar21);
  }
  this_01 = &l->sorted_features;
  if ((local_58 != 0.0) || (NAN(local_58))) {
    piVar18 = (l->sorted_features).super__Vector_base<index_feature,_std::allocator<index_feature>_>
              ._M_impl.super__Vector_impl_data._M_start;
    piVar11 = (l->sorted_features).super__Vector_base<index_feature,_std::allocator<index_feature>_>
              ._M_impl.super__Vector_impl_data._M_finish + -1;
    local_50 = this_01;
    local_48 = this_00;
    if (piVar18 <= piVar11) {
      this = &(pvVar2->weights).sparse_weights;
      piVar24 = piVar18;
LAB_001c60bf:
      do {
        piVar6 = piVar18;
        if (piVar6 + 1 <= piVar11) {
          piVar18 = piVar6 + 1;
          if (piVar6[1].f.weight_index == (piVar24->f).weight_index) goto LAB_001c60bf;
        }
        uVar19 = (piVar24->f).weight_index;
        if ((pvVar2->weights).sparse == true) {
          pwVar8 = sparse_parameters::operator[](this,uVar19);
        }
        else {
          pwVar8 = (pvVar2->weights).dense_weights._begin +
                   (uVar19 & (pvVar2->weights).dense_weights._weight_mask);
        }
        if (l->all->lda != 0) {
          uVar19 = 0;
          do {
            pwVar8[uVar19] = pwVar8[uVar19] * local_54;
            uVar19 = uVar19 + 1;
          } while (uVar19 < l->all->lda);
        }
        do {
          uVar20 = l->all->lda * piVar24->document;
          uVar19 = (piVar24->f).weight_index;
          pfVar16 = (l->v)._begin;
          if ((pvVar2->weights).sparse == true) {
            pwVar8 = sparse_parameters::operator[](this,uVar19);
          }
          else {
            pwVar8 = (pvVar2->weights).dense_weights._begin +
                     (uVar19 & (pvVar2->weights).dense_weights._weight_mask);
          }
          uVar19 = (ulong)l->all->lda;
          if (l->topics == 0) {
            fVar26 = 0.0;
          }
          else {
            fVar26 = 0.0;
            lVar21 = 0;
            do {
              fVar26 = fVar26 + *(float *)((long)pwVar8 + lVar21 + uVar19 * 4 + 4) *
                                *(float *)((long)pfVar16 + lVar21 + (ulong)uVar20 * 4);
              lVar21 = lVar21 + 4;
            } while (l->topics << 2 != lVar21);
          }
          fVar26 = (1.0 / fVar26) * local_58 * (piVar24->f).x;
          uVar22 = (piVar24->f).weight_index;
          if ((pvVar2->weights).sparse == true) {
            local_40 = (v_array<example_*> *)CONCAT44(local_40._4_4_,fVar26);
            pwVar12 = sparse_parameters::operator[](this,uVar22);
            fVar26 = local_40._0_4_;
          }
          else {
            pwVar12 = (pvVar2->weights).dense_weights._begin +
                      (uVar22 & (pvVar2->weights).dense_weights._weight_mask);
          }
          if (l->all->lda != 0) {
            uVar22 = 0;
            do {
              fVar27 = pwVar8[uVar19 + uVar22 + 1] * pfVar16[uVar20 + uVar22] * fVar26;
              pfVar4 = (l->total_new)._begin;
              pfVar4[uVar22] = pfVar4[uVar22] + fVar27;
              pwVar12[uVar22] = fVar27 + pwVar12[uVar22];
              uVar22 = uVar22 + 1;
            } while (uVar22 < l->all->lda);
          }
          piVar18 = piVar24 + 1;
          bVar25 = piVar6 != piVar24;
          piVar24 = piVar18;
        } while (bVar25);
        piVar11 = (l->sorted_features).
                  super__Vector_base<index_feature,_std::allocator<index_feature>_>._M_impl.
                  super__Vector_impl_data._M_finish + -1;
      } while (piVar18 <= piVar11);
    }
    this_00 = local_48;
    this_01 = local_50;
    if (l->all->lda != 0) {
      uVar19 = 0;
      do {
        pfVar16 = (l->total_lambda)._begin;
        pfVar16[uVar19] = pfVar16[uVar19] * local_54;
        pfVar16 = (l->total_lambda)._begin;
        pfVar16[uVar19] = (l->total_new)._begin[uVar19] + pfVar16[uVar19];
        uVar19 = uVar19 + 1;
      } while (uVar19 < l->all->lda);
    }
  }
  std::vector<index_feature,_std::allocator<index_feature>_>::resize(this_01,0);
  v_array<example_*>::clear(this_00);
  v_array<int>::clear(&l->doc_lengths);
  return;
}

Assistant:

void learn_batch(lda &l)
{
  parameters &weights = l.all->weights;
  if (l.sorted_features.empty())  // FAST-PASS for real "true"
  {
    // This can happen when the socket connection is dropped by the client.
    // If l.sorted_features is empty, then l.sorted_features[0] does not
    // exist, so we should not try to take its address in the beginning of
    // the for loops down there. Since it seems that there's not much to
    // do in this case, we just return.
    for (size_t d = 0; d < l.examples.size(); d++)
    {
      l.examples[d]->pred.scalars.clear();
      l.examples[d]->pred.scalars.resize(l.topics);
      memset(l.examples[d]->pred.scalars.begin(), 0, l.topics * sizeof(float));
      l.examples[d]->pred.scalars.end() = l.examples[d]->pred.scalars.begin() + l.topics;

      l.examples[d]->pred.scalars.clear();
      return_example(*l.all, *l.examples[d]);
    }
    l.examples.clear();
    return;
  }

  float eta = -1;
  float minuseta = -1;

  if (l.total_lambda.size() == 0)
  {
    for (size_t k = 0; k < l.all->lda; k++) l.total_lambda.push_back(0.f);
    // This part does not work with sparse parameters
    size_t stride = weights.stride();
    for (size_t i = 0; i <= weights.mask(); i += stride)
    {
      weight *w = &(weights[i]);
      for (size_t k = 0; k < l.all->lda; k++) l.total_lambda[k] += w[k];
    }
  }

  l.example_t++;
  l.total_new.clear();
  for (size_t k = 0; k < l.all->lda; k++) l.total_new.push_back(0.f);

  size_t batch_size = l.examples.size();

  sort(l.sorted_features.begin(), l.sorted_features.end());

  eta = l.all->eta * l.powf((float)l.example_t, -l.all->power_t);
  minuseta = 1.0f - eta;
  eta *= l.lda_D / batch_size;
  l.decay_levels.push_back(l.decay_levels.last() + log(minuseta));

  l.digammas.clear();
  float additional = (float)(l.all->length()) * l.lda_rho;
  for (size_t i = 0; i < l.all->lda; i++) l.digammas.push_back(l.digamma(l.total_lambda[i] + additional));

  uint64_t last_weight_index = -1;
  for (index_feature *s = &l.sorted_features[0]; s <= &l.sorted_features.back(); s++)
  {
    if (last_weight_index == s->f.weight_index)
      continue;
    last_weight_index = s->f.weight_index;
    // float *weights_for_w = &(weights[s->f.weight_index]);
    float *weights_for_w = &(weights[s->f.weight_index & weights.mask()]);
    float decay_component =
        l.decay_levels.end()[-2] - l.decay_levels.end()[(int)(-1 - l.example_t + *(weights_for_w + l.all->lda))];
    float decay = fmin(1.0f, correctedExp(decay_component));
    float *u_for_w = weights_for_w + l.all->lda + 1;

    *(weights_for_w + l.all->lda) = (float)l.example_t;
    for (size_t k = 0; k < l.all->lda; k++)
    {
      weights_for_w[k] *= decay;
      u_for_w[k] = weights_for_w[k] + l.lda_rho;
    }

    l.expdigammify_2(*l.all, u_for_w, l.digammas.begin());
  }

  for (size_t d = 0; d < batch_size; d++)
  {
    float score = lda_loop(l, l.Elogtheta, &(l.v[d * l.all->lda]), l.examples[d], l.all->power_t);
    if (l.all->audit)
      GD::print_audit_features(*l.all, *l.examples[d]);
    // If the doc is empty, give it loss of 0.
    if (l.doc_lengths[d] > 0)
    {
      l.all->sd->sum_loss -= score;
      l.all->sd->sum_loss_since_last_dump -= score;
    }
    return_example(*l.all, *l.examples[d]);
  }

  // -t there's no need to update weights (especially since it's a noop)
  if (eta != 0)
  {
    for (index_feature *s = &l.sorted_features[0]; s <= &l.sorted_features.back();)
    {
      index_feature *next = s + 1;
      while (next <= &l.sorted_features.back() && next->f.weight_index == s->f.weight_index) next++;

      float *word_weights = &(weights[s->f.weight_index]);
      for (size_t k = 0; k < l.all->lda; k++, ++word_weights)
      {
        float new_value = minuseta * *word_weights;
        *word_weights = new_value;
      }

      for (; s != next; s++)
      {
        float *v_s = &(l.v[s->document * l.all->lda]);
        float *u_for_w = &(weights[s->f.weight_index]) + l.all->lda + 1;
        float c_w = eta * find_cw(l, u_for_w, v_s) * s->f.x;
        word_weights = &(weights[s->f.weight_index]);
        for (size_t k = 0; k < l.all->lda; k++, ++u_for_w, ++word_weights)
        {
          float new_value = *u_for_w * v_s[k] * c_w;
          l.total_new[k] += new_value;
          *word_weights += new_value;
        }
      }
    }

    for (size_t k = 0; k < l.all->lda; k++)
    {
      l.total_lambda[k] *= minuseta;
      l.total_lambda[k] += l.total_new[k];
    }
  }
  l.sorted_features.resize(0);

  l.examples.clear();
  l.doc_lengths.clear();
}